

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O1

void * Kernel::Clause::operator_new(size_t sz,uint lits)

{
  void *pvVar1;
  ulong uVar2;
  
  uVar2 = (ulong)lits * 8 + 0x7f & 0xffffffff0;
  if (uVar2 == 0) {
    pvVar1 = ::Lib::FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
    return pvVar1;
  }
  if (uVar2 < 0x11) {
    pvVar1 = ::Lib::FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    return pvVar1;
  }
  if (uVar2 < 0x19) {
    pvVar1 = ::Lib::FixedSizeAllocator<24UL>::alloc
                       ((FixedSizeAllocator<24UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    return pvVar1;
  }
  if (uVar2 < 0x21) {
    pvVar1 = ::Lib::FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    return pvVar1;
  }
  if (uVar2 < 0x31) {
    pvVar1 = ::Lib::FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    return pvVar1;
  }
  if (uVar2 < 0x41) {
    pvVar1 = ::Lib::FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    return pvVar1;
  }
  pvVar1 = ::operator_new(uVar2,0x10);
  return pvVar1;
}

Assistant:

void* Clause::operator new(size_t sz, unsigned lits)
{
  ASS_EQ(sz,sizeof(Clause));

  RSTAT_CTR_INC("clauses created");

  //We have to get sizeof(Clause) + (_length-1)*sizeof(Literal*)
  //this way, because _length-1 wouldn't behave well for
  //_length==0 on x64 platform.
  size_t size = sizeof(Clause) + lits * sizeof(Literal*);
  size -= sizeof(Literal*);

  return ALLOC_KNOWN(size,"Clause");
}